

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::Instr::Dump(Instr *this,int window)

{
  int local_24;
  Instr *pIStack_20;
  int i;
  Instr *instr;
  int window_local;
  Instr *this_local;
  
  Output::Print(L"-------------------------------------------------------------------------------");
  if (this != (Instr *)0x0) {
    local_24 = 0;
    for (pIStack_20 = this; pIStack_20->m_prev != (Instr *)0x0 && local_24 < window / 2;
        pIStack_20 = pIStack_20->m_prev) {
      local_24 = local_24 + 1;
    }
    local_24 = 0;
    for (; pIStack_20 != (Instr *)0x0 && local_24 < window; pIStack_20 = pIStack_20->m_next) {
      if (pIStack_20 == this) {
        Output::Print(L"=>");
      }
      Dump(pIStack_20);
      local_24 = local_24 + 1;
    }
  }
  return;
}

Assistant:

void
Instr::Dump(int window)
{
    Instr * instr;
    int i;

    Output::Print(_u("-------------------------------------------------------------------------------"));

    if (this == NULL)
    {
        return;
    }

    for (i = 0, instr = this; (instr->m_prev != NULL && i < window/2); instr = instr->m_prev, ++i)
    {} // Nothing


    for (i = 0; (instr != nullptr && i < window); instr = instr->m_next, ++i)
    {
        if (instr == this)
        {
            Output::Print(_u("=>"));
        }
        instr->Dump();
    }
}